

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchMessageType_Test::
~ExtensionDeclarationsTest_MismatchMessageType_Test
          (ExtensionDeclarationsTest_MismatchMessageType_Test *this)

{
  ExtensionDeclarationsTest_MismatchMessageType_Test *this_local;
  
  ~ExtensionDeclarationsTest_MismatchMessageType_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_P(ExtensionDeclarationsTest, MismatchMessageType) {
  absl::StatusOr<FileDescriptorProto> file_proto = ParameterizeFileProto(
      R"pb(
        name: "foo.proto"
        package: "ext.test"
        message_type {
          name: "Foo"
          extension_range {
            start: 4
            end: 99999
            options: {
              declaration: {
                number: 10
                full_name: ".ext.test.foo"
                type: ".ext.test.Foo"
              }
            }
          }
        }
        message_type { name: "Bar" }
        extension { extendee: "Foo" name: "foo" number: 10 type_name: "Bar" }
      )pb",
      GetParam());
  ASSERT_OK(file_proto);

  DescriptorPool pool;
  pool.EnforceExtensionDeclarations(ExtDeclEnforcementLevel::kAllExtensions);
  MockErrorCollector error_collector;
  EXPECT_EQ(pool.BuildFileCollectingErrors(*file_proto, &error_collector),
            nullptr);
  EXPECT_EQ(
      error_collector.text_,
      "foo.proto: ext.test.foo: EXTENDEE: \"ext.test.Foo\" extension field 10 "
      "is expected to be type \".ext.test.Foo\", not \".ext.test.Bar\".\n");
}